

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O1

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset)

{
  ulong uVar1;
  uint8_t uVar2;
  size_t sVar3;
  int8_t iVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  size_t o;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  void *local_58;
  int local_4c;
  
  pvVar9 = encoded.bytes;
  uVar11 = encoded.len;
  sVar3 = *offset;
  uVar8 = sVar3 + 1;
  *offset = uVar8;
  iVar7 = -2;
  if (uVar11 < uVar8) {
    return -2;
  }
  uVar2 = *(uint8_t *)((long)pvVar9 + sVar3);
  entry->kind = uVar2;
  uVar6 = 0x10ee18;
  switch(uVar2) {
  case 'A':
    sVar3 = *offset;
    uVar8 = sVar3 + 4;
    *offset = uVar8;
    if (uVar11 < uVar8) {
      return -2;
    }
    uVar6 = *(uint *)((long)pvVar9 + sVar3);
    local_58 = malloc(0x180);
    if (local_58 == (void *)0x0) {
      return -1;
    }
    uVar8 = (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) +
            uVar8;
    uVar11 = 0;
    if (*offset < uVar8) {
      local_4c = 0x10;
      lVar12 = 0;
      uVar11 = 0;
      do {
        pvVar9 = local_58;
        if ((long)local_4c <= (long)uVar11) {
          local_4c = local_4c * 2;
          pvVar9 = realloc(local_58,(long)local_4c * 0x18);
          if (pvVar9 == (void *)0x0) {
            iVar7 = -1;
            goto LAB_0010c128;
          }
        }
        local_58 = pvVar9;
        iVar7 = amqp_decode_field_value
                          (encoded,pool,(amqp_field_value_t *)(lVar12 + (long)local_58),offset);
        if (iVar7 < 0) goto LAB_0010c128;
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x18;
      } while (*offset < uVar8);
    }
    (entry->value).boolean = (int)uVar11;
    sVar3 = (uVar11 & 0xffffffff) * 0x18;
    pvVar9 = amqp_pool_alloc(pool,sVar3);
    (entry->value).bytes.bytes = pvVar9;
    iVar7 = -1;
    if (pvVar9 != (void *)0x0 || (int)uVar11 == 0) {
      memcpy(pvVar9,local_58,sVar3);
      iVar7 = 0;
    }
LAB_0010c128:
    free(local_58);
    return iVar7;
  case 'B':
    sVar3 = *offset;
    uVar8 = sVar3 + 1;
    *offset = uVar8;
    if (uVar11 < uVar8) {
      return -2;
    }
    iVar4 = *(int8_t *)((long)pvVar9 + sVar3);
LAB_0010bf6e:
    (entry->value).i8 = iVar4;
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010bdce_caseD_63;
  case 'D':
    sVar3 = *offset;
    uVar8 = sVar3 + 1;
    *offset = uVar8;
    if (uVar11 < uVar8) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar9 + sVar3);
    sVar3 = *offset;
    uVar8 = sVar3 + 4;
    *offset = uVar8;
    if (uVar11 < uVar8) {
      return -2;
    }
    uVar6 = *(uint *)((long)pvVar9 + sVar3);
    (entry->value).decimal.value =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    break;
  case 'F':
    iVar7 = amqp_decode_table(encoded,pool,&(entry->value).table,offset);
    return iVar7;
  case 'I':
    sVar3 = *offset;
    uVar8 = sVar3 + 4;
    *offset = uVar8;
    if (uVar8 <= uVar11) {
      uVar6 = *(uint *)((long)pvVar9 + sVar3);
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    }
LAB_0010bf91:
    if (uVar11 < uVar8) {
      return -2;
    }
LAB_0010bf96:
    (entry->value).boolean = uVar6;
    break;
  case 'L':
  case 'T':
switchD_0010bdce_caseD_64:
    sVar3 = *offset;
    uVar8 = sVar3 + 8;
    *offset = uVar8;
    if (uVar11 < uVar8) {
      return -2;
    }
    uVar8 = *(ulong *)((long)pvVar9 + sVar3);
    uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
LAB_0010bfb9:
    (entry->value).u64 = uVar8;
    break;
  case 'S':
switchD_0010be01_caseD_53:
    sVar3 = *offset;
    uVar8 = sVar3 + 4;
    *offset = uVar8;
    if (uVar11 < uVar8) {
      return -2;
    }
    uVar6 = *(uint *)((long)pvVar9 + sVar3);
    uVar10 = (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
                    );
    uVar1 = uVar10 + uVar8;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    (entry->value).bytes.bytes = (void *)((long)pvVar9 + uVar8);
    (entry->value).i64 = uVar10;
    break;
  case 'V':
    break;
  default:
    switch(uVar2) {
    case 'b':
      sVar3 = *offset;
      uVar8 = sVar3 + 1;
      *offset = uVar8;
      if (uVar11 < uVar8) {
        return -2;
      }
      iVar4 = *(int8_t *)((long)pvVar9 + sVar3);
      goto LAB_0010bf6e;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010bdce_caseD_63;
    case 'd':
      goto switchD_0010bdce_caseD_64;
    case 'f':
    case 'i':
      sVar3 = *offset;
      uVar8 = sVar3 + 4;
      *offset = uVar8;
      if (uVar11 < uVar8) {
        return -2;
      }
      uVar6 = *(uint *)((long)pvVar9 + sVar3);
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      goto LAB_0010bf96;
    case 'l':
      sVar3 = *offset;
      uVar8 = sVar3 + 8;
      *offset = uVar8;
      if (uVar11 < uVar8) {
        return -2;
      }
      uVar8 = *(ulong *)((long)pvVar9 + sVar3);
      uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      goto LAB_0010bfb9;
    case 's':
      sVar3 = *offset;
      uVar8 = sVar3 + 2;
      *offset = uVar8;
      if (uVar11 < uVar8) {
        return -2;
      }
      uVar5 = *(ushort *)((long)pvVar9 + sVar3);
      uVar5 = uVar5 << 8 | uVar5 >> 8;
      break;
    case 't':
      sVar3 = *offset;
      uVar8 = sVar3 + 1;
      *offset = uVar8;
      uVar6 = 0;
      if (uVar8 <= uVar11) {
        uVar6 = (uint)(*(char *)((long)pvVar9 + sVar3) != '\0');
      }
      goto LAB_0010bf91;
    case 'u':
      sVar3 = *offset;
      uVar8 = sVar3 + 2;
      *offset = uVar8;
      if (uVar11 < uVar8) {
        return -2;
      }
      uVar5 = *(ushort *)((long)pvVar9 + sVar3);
      uVar5 = uVar5 << 8 | uVar5 >> 8;
      break;
    default:
      if (uVar2 != 'x') {
        return -2;
      }
      goto switchD_0010be01_caseD_53;
    }
    (entry->value).u16 = uVar5;
  }
  iVar7 = 0;
switchD_0010bdce_caseD_63:
  return iVar7;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded,
                                   amqp_pool_t *pool,
                                   amqp_field_value_t *entry,
                                   size_t *offset)
{
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits) if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; break
#define SIMPLE_FIELD_DECODER(bits, dest, how) { uint##bits##_t val; if (!amqp_decode_##bits(encoded, offset, &val)) goto out; entry->value.dest = how; } break

  switch (entry->kind) {
  case AMQP_FIELD_KIND_BOOLEAN:
    SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

  case AMQP_FIELD_KIND_I8:
    SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
  case AMQP_FIELD_KIND_U8:
    TRIVIAL_FIELD_DECODER(8);

  case AMQP_FIELD_KIND_I16:
    SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
  case AMQP_FIELD_KIND_U16:
    TRIVIAL_FIELD_DECODER(16);

  case AMQP_FIELD_KIND_I32:
    SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
  case AMQP_FIELD_KIND_U32:
    TRIVIAL_FIELD_DECODER(32);

  case AMQP_FIELD_KIND_I64:
    SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
  case AMQP_FIELD_KIND_U64:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_F32:
    TRIVIAL_FIELD_DECODER(32);
    /* and by punning, f32 magically gets the right value...! */

  case AMQP_FIELD_KIND_F64:
    TRIVIAL_FIELD_DECODER(64);
    /* and by punning, f64 magically gets the right value...! */

  case AMQP_FIELD_KIND_DECIMAL:
    if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals)
        || !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
      goto out;
    }
    break;

  case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
  case AMQP_FIELD_KIND_BYTES: {
    uint32_t len;
    if (!amqp_decode_32(encoded, offset, &len)
        || !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
      goto out;
    }
    break;
  }

  case AMQP_FIELD_KIND_ARRAY:
    res = amqp_decode_array(encoded, pool, &(entry->value.array), offset);
    goto out;

  case AMQP_FIELD_KIND_TIMESTAMP:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_TABLE:
    res = amqp_decode_table(encoded, pool, &(entry->value.table), offset);
    goto out;

  case AMQP_FIELD_KIND_VOID:
    break;

  default:
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}